

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O0

void jsoncons::bson::detail::init_hex_char_pairs(oid_t *oid,uint16_t *data)

{
  byte *pbVar1;
  uint16_t *puVar2;
  uint16_t *in_RSI;
  uint16_t *gHexCharPairs;
  uint8_t *bytes;
  
  pbVar1 = oid_t::data((oid_t *)0x1f1208);
  puVar2 = get_hex_char_pairs();
  *in_RSI = puVar2[*pbVar1];
  in_RSI[1] = puVar2[pbVar1[1]];
  in_RSI[2] = puVar2[pbVar1[2]];
  in_RSI[3] = puVar2[pbVar1[3]];
  in_RSI[4] = puVar2[pbVar1[4]];
  in_RSI[5] = puVar2[pbVar1[5]];
  in_RSI[6] = puVar2[pbVar1[6]];
  in_RSI[7] = puVar2[pbVar1[7]];
  in_RSI[8] = puVar2[pbVar1[8]];
  in_RSI[9] = puVar2[pbVar1[9]];
  in_RSI[10] = puVar2[pbVar1[10]];
  in_RSI[0xb] = puVar2[pbVar1[0xb]];
  return;
}

Assistant:

inline
        void init_hex_char_pairs(const oid_t& oid, uint16_t* data)
        {
            const uint8_t* bytes = oid.data();
            const uint16_t* gHexCharPairs = get_hex_char_pairs(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>());

            data[0] = gHexCharPairs[bytes[0]];
            data[1] = gHexCharPairs[bytes[1]];
            data[2] = gHexCharPairs[bytes[2]];
            data[3] = gHexCharPairs[bytes[3]];
            data[4] = gHexCharPairs[bytes[4]];
            data[5] = gHexCharPairs[bytes[5]];
            data[6] = gHexCharPairs[bytes[6]];
            data[7] = gHexCharPairs[bytes[7]];
            data[8] = gHexCharPairs[bytes[8]];
            data[9] = gHexCharPairs[bytes[9]];
            data[10] = gHexCharPairs[bytes[10]];
            data[11] = gHexCharPairs[bytes[11]];
        }